

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::resetAuxDegrees(Graph *this)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  Edge *pEVar3;
  
  for (pVVar2 = this->verticesList; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex) {
    for (pEVar3 = pVVar2->edgesList; pEVar3 != (Edge *)0x0; pEVar3 = pEVar3->nextEdge) {
      pVVar1 = pEVar3->destiny;
      pEVar3->origin->auxDegree = pEVar3->origin->indegree;
      pVVar1->auxDegree = pVVar1->indegree;
    }
  }
  return;
}

Assistant:

void Graph::resetAuxDegrees(){
    for(Vertex *v = this->verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            Vertex *orig, *dest;
            orig = e->getOrigin();
            dest = e->getDestiny();

            orig->setAuxDegree(orig->getOutdegree());
            dest->setAuxDegree(dest->getOutdegree());
        }
    }
}